

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::Initialize(CommandLineArguments *this,int argc,char **argv)

{
  long lVar1;
  String SStack_48;
  
  Initialize(this);
  String::String(&SStack_48,*argv);
  std::__cxx11::string::operator=((string *)&this->Internals->Argv0,(string *)&SStack_48);
  std::__cxx11::string::~string((string *)&SStack_48);
  for (lVar1 = 1; lVar1 < argc; lVar1 = lVar1 + 1) {
    ProcessArgument(this,argv[lVar1]);
  }
  return;
}

Assistant:

void CommandLineArguments::Initialize(int argc, const char* const argv[])
{
  int cc;

  this->Initialize();
  this->Internals->Argv0 = argv[0];
  for (cc = 1; cc < argc; cc++) {
    this->ProcessArgument(argv[cc]);
  }
}